

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseJsonName
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *output;
  LocationRecorder location;
  LocationRecorder value_location;
  
  if (((field->_has_bits_).has_bits_[0] & 0x10) != 0) {
    std::__cxx11::string::string
              ((string *)&location,"Already set option \"json_name\".",(allocator *)&value_location)
    ;
    AddError(this,(string *)&location);
    std::__cxx11::string::~string((string *)&location);
    FieldDescriptorProto::clear_json_name(field);
  }
  LocationRecorder::LocationRecorder(&location,field_location,10);
  LocationRecorder::RecordLegacyLocation(&location,&field->super_Message,OPTION_NAME);
  bVar1 = Consume(this,"json_name");
  if (bVar1) {
    bVar1 = Consume(this,"=");
    if (bVar1) {
      LocationRecorder::LocationRecorder(&value_location,&location);
      LocationRecorder::RecordLegacyLocation(&value_location,&field->super_Message,OPTION_VALUE);
      output = FieldDescriptorProto::_internal_mutable_json_name_abi_cxx11_(field);
      bVar1 = ConsumeString(this,output,"Expected string for JSON name.");
      LocationRecorder::~LocationRecorder(&value_location);
      goto LAB_003231bd;
    }
  }
  bVar1 = false;
LAB_003231bd:
  LocationRecorder::~LocationRecorder(&location);
  return bVar1;
}

Assistant:

bool Parser::ParseJsonName(FieldDescriptorProto* field,
                           const LocationRecorder& field_location,
                           const FileDescriptorProto* containing_file) {
  if (field->has_json_name()) {
    AddError("Already set option \"json_name\".");
    field->clear_json_name();
  }

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kJsonNameFieldNumber);
  location.RecordLegacyLocation(field,
                                DescriptorPool::ErrorCollector::OPTION_NAME);

  DO(Consume("json_name"));
  DO(Consume("="));

  LocationRecorder value_location(location);
  value_location.RecordLegacyLocation(
      field, DescriptorPool::ErrorCollector::OPTION_VALUE);

  DO(ConsumeString(field->mutable_json_name(),
                   "Expected string for JSON name."));
  return true;
}